

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::anon_unknown_12::ScanLineProcess::copy_sample_count
          (ScanLineProcess *this,DeepFrameBuffer *outfb,int fbY)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int32_t *piVar4;
  Slice *pSVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  char *__dest;
  long lVar9;
  long lVar10;
  
  pSVar5 = DeepFrameBuffer::getSampleCountSlice(outfb);
  lVar10 = (long)(this->cinfo).height - (long)(this->decoder).user_line_end_ignore;
  iVar1 = (this->decoder).user_line_begin_skip;
  lVar9 = (long)iVar1;
  if (iVar1 < (int)lVar10) {
    sVar2 = pSVar5->xStride;
    sVar3 = pSVar5->yStride;
    lVar8 = lVar9 * 4;
    do {
      lVar7 = (long)(this->cinfo).width;
      __dest = pSVar5->base + (lVar9 + fbY) * sVar3 + (long)(this->cinfo).start_x * sVar2;
      piVar4 = (this->decoder).sample_count_table;
      if (sVar2 == 4) {
        memcpy(__dest,piVar4 + lVar9 * lVar7,lVar7 << 2);
      }
      else if (0 < (this->cinfo).width) {
        lVar6 = 0;
        do {
          *(undefined4 *)__dest = *(undefined4 *)((long)piVar4 + lVar6 * 4 + lVar7 * lVar8);
          __dest = __dest + sVar2;
          lVar6 = lVar6 + 1;
        } while (lVar6 < (this->cinfo).width);
      }
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 4;
    } while (lVar9 < lVar10);
  }
  return;
}

Assistant:

void ScanLineProcess::copy_sample_count (
    const DeepFrameBuffer *outfb,
    int fbY)
{
    const Slice& scslice = outfb->getSampleCountSlice ();

    int     end = cinfo.height - decoder.user_line_end_ignore;
    int64_t xS = int64_t (scslice.xStride);
    int64_t yS = int64_t (scslice.yStride);

    for ( int y = decoder.user_line_begin_skip; y < end; ++y )
    {
        const int32_t* counts = decoder.sample_count_table + y * cinfo.width;
        uint8_t*       ptr;

        ptr = reinterpret_cast<uint8_t*> (scslice.base);
        ptr += int64_t (cinfo.start_x) * xS;
        ptr += (int64_t (fbY) + int64_t (y)) * yS;

        if (xS == sizeof(int32_t))
        {
            memcpy (ptr, counts, cinfo.width * sizeof(int32_t));
        }
        else
        {
            for ( int x = 0; x < cinfo.width; ++x )
            {
                *((int32_t *)ptr) = counts[x];
                ptr += xS;
            }
        }
    }
}